

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::LoadTextFileCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  char *filenameToLoad;
  PAL_FILE *stream;
  LPCSTR pCVar2;
  int local_8c;
  UINT local_88 [2];
  UINT lengthBytes;
  undefined1 local_78 [8];
  AutoString fileName;
  char *fileContent;
  JsValueRef pvStack_48;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  void *pvStack_38;
  HRESULT hr;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = -0x7fffbffb;
  pvStack_48 = (JsValueRef)0x0;
  fileName.errorCode = JsNoError;
  fileName.dontFree = false;
  fileName._29_3_ = 0;
  pvStack_38 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_28 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_18 = callee;
  if (argumentCount < 2) {
    JVar1 = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffb8);
    if (JVar1 != JsNoError) {
      returnValue._4_4_ = -0x7fffbffb;
    }
  }
  else {
    AutoString::AutoString((AutoString *)local_78);
    JVar1 = AutoString::Initialize((AutoString *)local_78,ppvStack_28[1]);
    if (JVar1 == JsNoError) {
      local_88[0] = 0;
      filenameToLoad = AutoString::operator*((AutoString *)local_78);
      returnValue._4_4_ =
           Helpers::LoadScriptFromFile
                     (filenameToLoad,(LPCSTR *)&fileName.errorCode,local_88,(string *)0x0,false);
      if (returnValue._4_4_ < 0) {
        stream = PAL_get_stderr(0);
        pCVar2 = AutoString::GetString((AutoString *)local_78);
        PAL_fprintf(stream,"Couldn\'t load file \'%s\'\n",pCVar2);
        JVar1 = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffb8);
        if (JVar1 == JsNoError) {
          callee_local = pvStack_48;
          local_8c = 1;
        }
        else {
          returnValue._4_4_ = -0x7fffbffb;
          local_8c = 4;
        }
      }
      else {
        JVar1 = ChakraRTInterface::JsCreateString
                          ((char *)fileName._24_8_,(ulong)local_88[0],&stack0xffffffffffffffb8);
        if (JVar1 == JsNoError) {
          local_8c = 0;
        }
        else {
          returnValue._4_4_ = -0x7fffbffb;
          local_8c = 4;
        }
      }
    }
    else {
      returnValue._4_4_ = -0x7fffbffb;
      local_8c = 4;
    }
    AutoString::~AutoString((AutoString *)local_78);
    if ((local_8c != 0) && (local_8c == 1)) {
      return callee_local;
    }
  }
  if (fileName._24_8_ != 0) {
    free((void *)fileName._24_8_);
  }
  return pvStack_48;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::LoadTextFileCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;
    const char* fileContent = nullptr;

    if (argumentCount < 2)
    {
        IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
    }
    else
    {
        AutoString fileName;

        IfJsrtErrorSetGo(fileName.Initialize(arguments[1]));

        if (errorCode == JsNoError)
        {
            UINT lengthBytes = 0;
            hr = Helpers::LoadScriptFromFile(*fileName, fileContent, &lengthBytes);

            if (FAILED(hr))
            {
                fprintf(stderr, "Couldn't load file '%s'\n", fileName.GetString());
                IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
                return returnValue;
            }

            IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(
                fileContent, lengthBytes, &returnValue));
        }
    }

Error:
    if (fileContent)
    {
        free((void*)fileContent);
    }
    return returnValue;
}